

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzquadratictetra.cpp
# Opt level: O0

void pzgeom::TPZQuadraticTetra::GradX<double>
               (TPZFMatrix<double> *nodes,TPZVec<double> *loc,TPZFMatrix<double> *gradx)

{
  double dVar1;
  double *pdVar2;
  long *in_RDX;
  TPZBaseMatrix *in_RDI;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double col;
  int j;
  int i;
  TPZFNMatrix<30,_double> dphi;
  TPZFNMatrix<10,_double> phi;
  int ncol;
  int nrow;
  double in_stack_fffffffffffffd00;
  double in_stack_fffffffffffffd08;
  TPZFNMatrix<30,_double> *in_stack_fffffffffffffd10;
  int local_2a4;
  int local_2a0;
  TPZFMatrix<double> *in_stack_fffffffffffffdf0;
  TPZFMatrix<double> *in_stack_fffffffffffffdf8;
  TPZVec<double> *in_stack_fffffffffffffe00;
  
  (**(code **)(*in_RDX + 0x68))(in_RDX,3);
  (**(code **)(*in_RDX + 0x78))();
  TPZBaseMatrix::Rows(in_RDI);
  TPZBaseMatrix::Cols(in_RDI);
  TPZFNMatrix<10,_double>::TPZFNMatrix
            ((TPZFNMatrix<10,_double> *)in_stack_fffffffffffffd10,(int64_t)in_stack_fffffffffffffd08
             ,(int64_t)in_stack_fffffffffffffd00);
  TPZFNMatrix<30,_double>::TPZFNMatrix
            (in_stack_fffffffffffffd10,(int64_t)in_stack_fffffffffffffd08,
             (int64_t)in_stack_fffffffffffffd00);
  TShape<double>(in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8,in_stack_fffffffffffffdf0);
  for (local_2a0 = 0; local_2a0 < 10; local_2a0 = local_2a0 + 1) {
    for (local_2a4 = 0; local_2a4 < 3; local_2a4 = local_2a4 + 1) {
      (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x24])(in_RDI,(long)local_2a4,(long)local_2a0);
      pdVar2 = TPZFMatrix<double>::operator()
                         (&in_stack_fffffffffffffd10->super_TPZFMatrix<double>,
                          (int64_t)in_stack_fffffffffffffd08,(int64_t)in_stack_fffffffffffffd00);
      dVar1 = *pdVar2;
      pdVar2 = TPZFMatrix<double>::operator()
                         (&in_stack_fffffffffffffd10->super_TPZFMatrix<double>,
                          (int64_t)in_stack_fffffffffffffd08,(int64_t)in_stack_fffffffffffffd00);
      *pdVar2 = extraout_XMM0_Qa * dVar1 + *pdVar2;
      (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x24])(in_RDI,(long)local_2a4,(long)local_2a0);
      pdVar2 = TPZFMatrix<double>::operator()
                         (&in_stack_fffffffffffffd10->super_TPZFMatrix<double>,
                          (int64_t)in_stack_fffffffffffffd08,(int64_t)in_stack_fffffffffffffd00);
      in_stack_fffffffffffffd08 = *pdVar2;
      in_stack_fffffffffffffd10 =
           (TPZFNMatrix<30,_double> *)
           TPZFMatrix<double>::operator()
                     (&in_stack_fffffffffffffd10->super_TPZFMatrix<double>,
                      (int64_t)in_stack_fffffffffffffd08,(int64_t)in_stack_fffffffffffffd00);
      (in_stack_fffffffffffffd10->super_TPZFMatrix<double>).super_TPZMatrix<double>.
      super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
           (_func_int **)
           (extraout_XMM0_Qa_00 * in_stack_fffffffffffffd08 +
           (double)(in_stack_fffffffffffffd10->super_TPZFMatrix<double>).super_TPZMatrix<double>.
                   super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable);
      (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x24])(in_RDI,(long)local_2a4,(long)local_2a0);
      in_stack_fffffffffffffd00 = col;
      pdVar2 = TPZFMatrix<double>::operator()
                         (&in_stack_fffffffffffffd10->super_TPZFMatrix<double>,
                          (int64_t)in_stack_fffffffffffffd08,(int64_t)col);
      dVar1 = *pdVar2;
      pdVar2 = TPZFMatrix<double>::operator()
                         (&in_stack_fffffffffffffd10->super_TPZFMatrix<double>,
                          (int64_t)in_stack_fffffffffffffd08,(int64_t)in_stack_fffffffffffffd00);
      *pdVar2 = in_stack_fffffffffffffd00 * dVar1 + *pdVar2;
    }
  }
  TPZFNMatrix<30,_double>::~TPZFNMatrix((TPZFNMatrix<30,_double> *)0x185db14);
  TPZFNMatrix<10,_double>::~TPZFNMatrix((TPZFNMatrix<10,_double> *)0x185db21);
  return;
}

Assistant:

void TPZQuadraticTetra::GradX(const TPZFMatrix<REAL> &nodes,TPZVec<T> &loc, TPZFMatrix<T> &gradx){
    
    gradx.Resize(3,3);
    gradx.Zero();
    int nrow = nodes.Rows();
    int ncol = nodes.Cols();
#ifdef PZDEBUG
    if(nrow != 3 || ncol  != 10){
        std::cout << "Objects of incompatible lengths, gradient cannot be computed." << std::endl;
        std::cout << "nodes matrix must be 3x10." << std::endl;
        DebugStop();
    }
    
#endif
    TPZFNMatrix<10,T> phi(NNodes,1);
    TPZFNMatrix<30,T> dphi(3,NNodes);
    TShape(loc,phi,dphi);
    for(int i = 0; i < NNodes; i++)
    {
        for(int j = 0; j < 3; j++)
        {
            gradx(j,0) += nodes.GetVal(j,i)*dphi(0,i);
            gradx(j,1) += nodes.GetVal(j,i)*dphi(1,i);
            gradx(j,2) += nodes.GetVal(j,i)*dphi(2,i);
        }
    }
    
}